

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_15::BinaryReaderIR::PushLabel
          (BinaryReaderIR *this,LabelType label_type,ExprList *first,Expr *context)

{
  pointer pLVar1;
  pointer pLVar2;
  ExprList *pEVar3;
  undefined4 uVar4;
  ulong uVar5;
  pointer pLVar6;
  pointer pLVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  pointer pLVar11;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar1 == (this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pLVar2 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar10 = (long)pLVar1 - (long)pLVar2;
    if (lVar10 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar8 = (lVar10 >> 3) * -0x5555555555555555;
    uVar5 = 1;
    if (pLVar1 != pLVar2) {
      uVar5 = uVar8;
    }
    uVar9 = uVar5 + uVar8;
    if (0x555555555555554 < uVar9) {
      uVar9 = 0x555555555555555;
    }
    if (CARRY8(uVar5,uVar8)) {
      uVar9 = 0x555555555555555;
    }
    pLVar6 = (pointer)operator_new(uVar9 * 0x18);
    *(LabelType *)((long)pLVar6 + lVar10) = label_type;
    *(ExprList **)((long)pLVar6 + lVar10 + 8) = first;
    *(Expr **)((long)pLVar6 + lVar10 + 0x10) = context;
    pLVar11 = pLVar6;
    for (pLVar7 = pLVar2; pLVar1 != pLVar7; pLVar7 = pLVar7 + 1) {
      pLVar11->context = pLVar7->context;
      uVar4 = *(undefined4 *)&pLVar7->field_0x4;
      pEVar3 = pLVar7->exprs;
      pLVar11->label_type = pLVar7->label_type;
      *(undefined4 *)&pLVar11->field_0x4 = uVar4;
      pLVar11->exprs = pEVar3;
      pLVar11 = pLVar11 + 1;
    }
    if (pLVar2 != (pointer)0x0) {
      operator_delete(pLVar2,(long)(this->label_stack_).
                                   super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar2
                     );
    }
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_start = pLVar6;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar11 + 1;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar6 + uVar9;
  }
  else {
    pLVar1->label_type = label_type;
    pLVar1->exprs = first;
    pLVar1->context = context;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar1 + 1;
  }
  return;
}

Assistant:

void BinaryReaderIR::PushLabel(LabelType label_type,
                               ExprList* first,
                               Expr* context) {
  label_stack_.emplace_back(label_type, first, context);
}